

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

APInt __thiscall llvm::APInt::ssub_ov(APInt *this,APInt *RHS,bool *Overflow)

{
  bool bVar1;
  bool bVar2;
  undefined8 in_RCX;
  ulong uVar3;
  ulong extraout_RDX;
  APInt AVar4;
  bool local_41;
  APInt local_40;
  undefined1 local_29;
  undefined8 local_28;
  bool *Overflow_local;
  APInt *RHS_local;
  APInt *this_local;
  APInt *Res;
  
  local_29 = 0;
  local_28 = in_RCX;
  Overflow_local = Overflow;
  RHS_local = RHS;
  this_local = this;
  APInt(&local_40,RHS);
  llvm::operator-((llvm *)this,&local_40,(APInt *)Overflow_local);
  ~APInt(&local_40);
  bVar1 = isNonNegative(RHS);
  bVar2 = isNonNegative((APInt *)Overflow_local);
  uVar3 = (ulong)bVar2;
  local_41 = false;
  if (bVar1 != bVar2) {
    bVar1 = isNonNegative(this);
    bVar2 = isNonNegative(RHS);
    local_41 = bVar1 != bVar2;
    uVar3 = extraout_RDX;
  }
  *(bool *)local_28 = local_41;
  AVar4._8_8_ = uVar3;
  AVar4.U.pVal = (uint64_t *)this;
  return AVar4;
}

Assistant:

APInt APInt::ssub_ov(const APInt &RHS, bool &Overflow) const {
  APInt Res = *this - RHS;
  Overflow = isNonNegative() != RHS.isNonNegative() &&
             Res.isNonNegative() != isNonNegative();
  return Res;
}